

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

UInt32 crnlib::ReadMatchDistances(CLzmaEnc *p,UInt32 *numDistancePairsRes)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  int *in_RSI;
  long in_RDI;
  bool bVar4;
  Byte *pby2;
  UInt32 numAvail;
  UInt32 distance;
  Byte *pby;
  UInt32 numPairs;
  UInt32 lenRes;
  uint local_28;
  UInt32 local_14;
  
  local_14 = 0;
  uVar1 = (**(code **)(in_RDI + 0x10))(*(undefined8 *)(in_RDI + 0x30));
  *(undefined4 *)(in_RDI + 0x4d0) = uVar1;
  iVar2 = (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x30),in_RDI + 0x326d4);
  if ((iVar2 != 0) &&
     (local_14 = *(UInt32 *)(in_RDI + 0x326d4 + (ulong)(iVar2 - 2) * 4),
     local_14 == *(UInt32 *)(in_RDI + 0x32f68))) {
    lVar3 = (**(code **)(in_RDI + 0x18))(*(undefined8 *)(in_RDI + 0x30));
    local_28 = *(uint *)(in_RDI + 0x4d0);
    if (0x111 < local_28) {
      local_28 = 0x111;
    }
    while( true ) {
      bVar4 = false;
      if (local_14 < local_28) {
        bVar4 = *(char *)(lVar3 + -1 + (ulong)local_14) ==
                *(char *)(((lVar3 + -1) -
                          (ulong)(*(int *)(in_RDI + 0x326d4 + (ulong)(iVar2 - 1) * 4) + 1)) +
                         (ulong)local_14);
      }
      if (!bVar4) break;
      local_14 = local_14 + 1;
    }
  }
  *(int *)(in_RDI + 0x32f6c) = *(int *)(in_RDI + 0x32f6c) + 1;
  *in_RSI = iVar2;
  return local_14;
}

Assistant:

static UInt32 ReadMatchDistances(CLzmaEnc* p, UInt32* numDistancePairsRes) {
  UInt32 lenRes = 0, numPairs;
  p->numAvail = p->matchFinder.GetNumAvailableBytes(p->matchFinderObj);
  numPairs = p->matchFinder.GetMatches(p->matchFinderObj, p->matches);
#ifdef SHOW_STAT
  printf("\n i = %d numPairs = %d    ", ttt, numPairs / 2);
  ttt++;
  {
    UInt32 i;
    for (i = 0; i < numPairs; i += 2)
      printf("%2d %6d   | ", p->matches[i], p->matches[i + 1]);
  }
#endif
  if (numPairs > 0) {
    lenRes = p->matches[numPairs - 2];
    if (lenRes == p->numFastBytes) {
      const Byte* pby = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
      UInt32 distance = p->matches[numPairs - 1] + 1;
      UInt32 numAvail = p->numAvail;
      if (numAvail > LZMA_MATCH_LEN_MAX)
        numAvail = LZMA_MATCH_LEN_MAX;
      {
        const Byte* pby2 = pby - distance;
        for (; lenRes < numAvail && pby[lenRes] == pby2[lenRes]; lenRes++)
          ;
      }
    }
  }
  p->additionalOffset++;
  *numDistancePairsRes = numPairs;
  return lenRes;
}